

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O2

void __thiscall
Assimp::IFC::TempMesh::ComputePolygonNormals
          (TempMesh *this,vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *normals,
          bool normalize,size_t ofs)

{
  uint *puVar1;
  pointer paVar2;
  aiVector3t<double> *paVar3;
  int iVar4;
  long lVar5;
  uint *puVar6;
  long lVar7;
  ulong uVar8;
  IfcVector3 *n;
  long lVar9;
  aiVector3t<double> *this_00;
  uint uVar10;
  uint *puVar11;
  vector<double,_std::allocator<double>_> temp;
  aiVector3t<double> local_48;
  
  puVar1 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar8 = 0;
  puVar11 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start + ofs;
  for (puVar6 = puVar11; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    if (uVar8 <= *puVar6) {
      uVar8 = (ulong)*puVar6;
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&temp,uVar8 * 4 + 8,(allocator_type *)&local_48);
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (normals,((long)(this->mVertcnt).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->mVertcnt).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) +
                     (((long)(normals->
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(normals->
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x18 - ofs));
  iVar4 = 0;
  for (puVar6 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar6 != puVar11; puVar6 = puVar6 + 1) {
    iVar4 = iVar4 + *puVar6;
  }
  lVar9 = (long)iVar4;
  for (; puVar11 != puVar1; puVar11 = puVar11 + 1) {
    uVar10 = *puVar11;
    if (uVar10 == 0) {
      local_48.x = 0.0;
      local_48.y = 0.0;
      local_48.z = 0.0;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)normals,&local_48)
      ;
    }
    else {
      lVar5 = lVar9 * 0x18 + 0x10;
      lVar7 = 0;
      for (uVar8 = 0; uVar8 < uVar10; uVar8 = uVar8 + 1) {
        paVar2 = (this->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)
         ((long)temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar7) =
             *(undefined8 *)((long)paVar2 + lVar5 + -0x10);
        *(undefined8 *)
         ((long)temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar7 + 8) =
             *(undefined8 *)((long)paVar2 + lVar5 + -8);
        *(undefined8 *)
         ((long)temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar7 + 0x10) =
             *(undefined8 *)((long)&paVar2->x + lVar5);
        *(undefined8 *)
         ((long)temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar7 + 0x18) = 0x7ff8000000000000;
        uVar10 = *puVar11;
        lVar5 = lVar5 + 0x18;
        lVar7 = lVar7 + 0x20;
      }
      local_48.x = 0.0;
      local_48.y = 0.0;
      local_48.z = 0.0;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)normals,&local_48)
      ;
      NewellNormal<4,4,4,double>
                ((normals->
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish + -1,*puVar11,
                 temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1,
                 temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 2);
    }
    lVar9 = lVar9 + (ulong)*puVar11;
  }
  if (normalize) {
    paVar3 = (normals->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (normals->
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                   _M_impl.super__Vector_impl_data._M_start; this_00 != paVar3;
        this_00 = this_00 + 1) {
      aiVector3t<double>::Normalize(this_00);
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&temp.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void TempMesh::ComputePolygonNormals(std::vector<IfcVector3>& normals,
    bool normalize,
    size_t ofs) const
{
    size_t max_vcount = 0;
    std::vector<unsigned int>::const_iterator begin = mVertcnt.begin()+ofs, end = mVertcnt.end(),  iit;
    for(iit = begin; iit != end; ++iit) {
        max_vcount = std::max(max_vcount,static_cast<size_t>(*iit));
    }

    std::vector<IfcFloat> temp((max_vcount+2)*4);
    normals.reserve( normals.size() + mVertcnt.size()-ofs );

    // `NewellNormal()` currently has a relatively strange interface and need to
    // re-structure things a bit to meet them.
    size_t vidx = std::accumulate(mVertcnt.begin(),begin,0);
    for(iit = begin; iit != end; vidx += *iit++) {
        if (!*iit) {
            normals.push_back(IfcVector3());
            continue;
        }
        for(size_t vofs = 0, cnt = 0; vofs < *iit; ++vofs) {
            const IfcVector3& v = mVerts[vidx+vofs];
            temp[cnt++] = v.x;
            temp[cnt++] = v.y;
            temp[cnt++] = v.z;
#ifdef ASSIMP_BUILD_DEBUG
            temp[cnt] = std::numeric_limits<IfcFloat>::quiet_NaN();
#endif
            ++cnt;
        }

        normals.push_back(IfcVector3());
        NewellNormal<4,4,4>(normals.back(),*iit,&temp[0],&temp[1],&temp[2]);
    }

    if(normalize) {
        for(IfcVector3& n : normals) {
            n.Normalize();
        }
    }
}